

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O1

int transcode(int K,int symSize,string *inputFname,string *outputFname,string *inputEsiStr,
             string *outputEsiStr)

{
  uint32_t uVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  size_t __size;
  size_t __n;
  void *__ptr;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  string *psVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  pointer pcVar14;
  uint32_t *puVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  undefined1 *__s;
  bool bVar19;
  bool bVar20;
  uint32_t auStack_560 [2];
  undefined1 auStack_558 [16];
  ifstream ifs;
  byte abStack_530 [488];
  long local_348;
  ofstream ofs;
  byte abStack_328 [216];
  ios_base local_250 [264];
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  size_t local_c8;
  size_t interWorkSize;
  size_t interProgSize;
  size_t iblockSymCnt;
  size_t outWorkSize;
  undefined8 local_a0;
  size_t local_98;
  size_t outProgSize;
  ulong local_88;
  string *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  ulong local_68;
  uint local_60;
  uint local_5c;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  uint local_34;
  
  local_78 = (undefined1 *)CONCAT44(local_78._4_4_,symSize);
  local_40 = (void *)CONCAT44(local_40._4_4_,K);
  auStack_560[0] = 0x102cbf;
  auStack_560[1] = 0;
  local_80 = outputEsiStr;
  std::ifstream::ifstream(auStack_558 + 8,(string *)inputFname,_S_bin|_S_ate);
  auStack_560[0] = 0x102cc7;
  auStack_560[1] = 0;
  uVar6 = std::istream::tellg();
  auStack_560[0] = 0x102cda;
  auStack_560[1] = 0;
  std::istream::seekg((long)(auStack_558 + 8),_S_beg);
  auStack_560[0] = 0x102cee;
  auStack_560[1] = 0;
  std::ofstream::ofstream(&local_348,(string *)outputFname,_S_bin);
  if ((abStack_530[*(long *)(auStack_558._8_8_ + -0x18)] & 5) == 0) {
    if ((abStack_328[*(long *)(local_348 + -0x18)] & 5) == 0) {
      pcVar14 = (inputEsiStr->_M_dataplus)._M_p;
      auStack_560[0] = 0x102d48;
      auStack_560[1] = 0;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_a0 = uVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar14,pcVar14 + inputEsiStr->_M_string_length);
      auStack_560[0] = 0x102d54;
      auStack_560[1] = 0;
      uVar4 = getESICnt(&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        auStack_560[0] = 0x102d71;
        auStack_560[1] = 0;
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_88 = (ulong)(uVar4 * (int)local_78);
      local_70 = auStack_558 + -(local_88 + 0xf & 0xfffffffffffffff0);
      puVar15 = (uint32_t *)(local_70 + -((ulong)uVar4 * 4 + 0xf & 0xfffffffffffffff0));
      pcVar14 = (inputEsiStr->_M_dataplus)._M_p;
      sVar2 = inputEsiStr->_M_string_length;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      outWorkSize = (size_t)auStack_558;
      puVar15[-2] = 0x102dd0;
      puVar15[-1] = 0;
      std::__cxx11::string::_M_construct<char*>((string *)&local_128,pcVar14,pcVar14 + sVar2);
      puVar15[-2] = 0x102ddf;
      puVar15[-1] = 0;
      parseESIStr(&local_128,(int)pcVar14,puVar15);
      _Var3._M_p = local_128._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        puVar15[-2] = 0x102dfa;
        puVar15[-1] = 0;
        operator_delete(_Var3._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)local_40 & 0xffffffff;
      iVar17 = uVar4 - (int)local_40;
      puVar15[-2] = 0x102e20;
      puVar15[-1] = 0;
      uVar5 = RqInterGetMemSizes(uVar11,iVar17,&local_c8,&interWorkSize,&interProgSize);
      local_5c = 0;
      local_34 = 0;
      if (uVar5 == 0) {
        puVar15[-2] = 0x102e51;
        puVar15[-1] = 0;
        pvVar7 = malloc(local_c8);
        uVar11 = (ulong)local_40 & 0xffffffff;
        puVar15[-2] = 0x102e65;
        puVar15[-1] = 0;
        uVar5 = RqInterInit(uVar11,iVar17,pvVar7,local_c8);
        if (uVar5 == 0) {
          if (0 < (int)uVar4) {
            uVar11 = 0;
            do {
              uVar1 = puVar15[uVar11];
              puVar15[-2] = 0x102e90;
              puVar15[-1] = 0;
              RqInterAddIds(pvVar7,uVar1,1);
              uVar11 = uVar11 + 1;
            } while (uVar4 != uVar11);
          }
          puVar15[-2] = 0x102ea7;
          puVar15[-1] = 0;
          pvVar8 = malloc(interWorkSize);
          puVar15[-2] = 0x102eb8;
          puVar15[-1] = 0;
          uVar5 = RqInterCompile(pvVar7,pvVar8,interWorkSize);
          psVar10 = local_80;
          if (uVar5 == 0) {
            pcVar14 = (local_80->_M_dataplus)._M_p;
            sVar2 = local_80->_M_string_length;
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            puVar15[-2] = 0x102eef;
            puVar15[-1] = 0;
            std::__cxx11::string::_M_construct<char*>((string *)&local_108,pcVar14,pcVar14 + sVar2);
            puVar15[-2] = 0x102efb;
            puVar15[-1] = 0;
            local_60 = getESICnt(&local_108);
            _Var3._M_p = local_108._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              puVar15[-2] = 0x102f19;
              puVar15[-1] = 0;
              operator_delete(_Var3._M_p,local_108.field_2._M_allocated_capacity + 1);
            }
            local_68 = (ulong)local_60;
            puVar15 = (uint32_t *)((long)puVar15 - (local_68 * 4 + 0xf & 0xfffffffffffffff0));
            pcVar14 = (psVar10->_M_dataplus)._M_p;
            sVar2 = psVar10->_M_string_length;
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar15[-2] = 0x102f5a;
            puVar15[-1] = 0;
            std::__cxx11::string::_M_construct<char*>((string *)&local_e8,pcVar14,pcVar14 + sVar2);
            puVar15[-2] = 0x102f69;
            puVar15[-1] = 0;
            parseESIStr(&local_e8,(int)pcVar14,puVar15);
            _Var3._M_p = local_e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              puVar15[-2] = 0x102f84;
              puVar15[-1] = 0;
              operator_delete(_Var3._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            uVar4 = local_60;
            uVar16 = local_60 * (int)local_78;
            psVar10 = (string *)((long)puVar15 - ((ulong)uVar16 + 0xf & 0xfffffffffffffff0));
            local_80 = psVar10;
            *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x102fb7;
            uVar5 = RqOutGetMemSizes(uVar4,&iblockSymCnt,&local_98);
            if (uVar5 != 0) {
              *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10350e;
              transcode();
              *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10351a;
              std::ifstream::close();
              *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103526;
              std::ofstream::close();
              local_34 = uVar5;
            }
            local_5c = 0;
            puVar13 = (undefined1 *)outWorkSize;
            uVar4 = local_5c;
            if (uVar5 == 0) {
              outProgSize = (ulong)uVar16;
              *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x102fe6;
              pvVar9 = malloc(iblockSymCnt);
              __size = local_98;
              *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x102ff5;
              local_50 = malloc(__size);
              uVar11 = (ulong)local_40 & 0xffffffff;
              local_40 = pvVar9;
              *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10300b;
              uVar5 = RqOutInit(uVar11,pvVar9,iblockSymCnt);
              if (uVar5 != 0) {
                *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10355c;
                fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                        ,0xdd,"RqOutInit(K, outWork, outWorkSize)",(ulong)uVar5);
                if (pvVar8 != (void *)0x0) {
                  *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103569;
                  free(pvVar8);
                }
                pvVar9 = local_50;
                if (pvVar7 != (void *)0x0) {
                  *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10357a;
                  free(pvVar7);
                }
                __ptr = local_40;
                if (local_40 != (void *)0x0) {
                  *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103588;
                  free(__ptr);
                }
                if (pvVar9 != (void *)0x0) {
                  *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103595;
                  free(pvVar9);
                }
                *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035a1;
                std::ifstream::close();
                *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035ad;
                std::ofstream::close();
                local_34 = uVar5;
              }
              uVar11 = local_68;
              puVar13 = (undefined1 *)outWorkSize;
              uVar4 = local_5c;
              if (uVar5 == 0) {
                local_48 = pvVar8;
                local_58 = pvVar7;
                bVar19 = 0 < (int)local_60;
                if (0 < (int)local_60) {
                  uVar12 = 1;
                  do {
                    pvVar7 = local_40;
                    uVar1 = puVar15[uVar12 - 1];
                    *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103052;
                    uVar4 = RqOutAddIds(pvVar7,uVar1,1);
                    if (uVar4 != 0) {
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030ad;
                      fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                              ,0xdf,"RqOutAddIds(outWork, ESIs_wanted[i], 1)",(ulong)uVar4);
                      pvVar7 = local_48;
                      if (local_48 != (void *)0x0) {
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030bb;
                        free(pvVar7);
                      }
                      pvVar7 = local_58;
                      if (local_58 != (void *)0x0) {
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030c9;
                        free(pvVar7);
                      }
                      pvVar7 = local_40;
                      if (local_40 != (void *)0x0) {
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030d7;
                        free(pvVar7);
                      }
                      pvVar7 = local_50;
                      if (local_50 != (void *)0x0) {
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030e5;
                        free(pvVar7);
                      }
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030f1;
                      std::ifstream::close();
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1030fd;
                      std::ofstream::close();
                      local_34 = uVar4;
                    }
                    if (uVar4 != 0) break;
                    bVar19 = uVar12 < local_68;
                    bVar20 = uVar12 != uVar11;
                    uVar12 = uVar12 + 1;
                  } while (bVar20);
                }
                pvVar8 = local_40;
                pvVar7 = local_50;
                puVar13 = (undefined1 *)outWorkSize;
                uVar4 = local_5c;
                if (!bVar19) {
                  *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1031fd;
                  uVar5 = RqOutCompile(pvVar8,pvVar7,local_98);
                  __s = local_70;
                  uVar11 = local_88;
                  if (uVar5 != 0) {
                    *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036a2;
                    fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                            ,0xe0,"RqOutCompile(outWork, outProgram, outProgSize)",(ulong)uVar5);
                    pvVar9 = local_48;
                    if (local_48 != (void *)0x0) {
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036b2;
                      free(pvVar9);
                    }
                    pvVar9 = local_58;
                    if (local_58 != (void *)0x0) {
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036c2;
                      free(pvVar9);
                    }
                    if (pvVar8 != (void *)0x0) {
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036cf;
                      free(pvVar8);
                    }
                    if (pvVar7 != (void *)0x0) {
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036dc;
                      free(pvVar7);
                    }
                    *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036e8;
                    std::ifstream::close();
                    *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1036f4;
                    std::ofstream::close();
                    local_34 = uVar5;
                  }
                  puVar13 = (undefined1 *)outWorkSize;
                  uVar4 = local_5c;
                  if (uVar5 == 0) {
                    local_68 = (ulong)(int)local_78;
                    uVar5 = -(int)uVar11;
                    do {
                      pvVar8 = local_40;
                      pvVar7 = local_48;
                      uVar5 = uVar5 + (int)uVar11;
                      if ((int)local_a0 <= (int)uVar5) {
                        if (local_48 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035c7;
                          free(pvVar7);
                        }
                        pvVar9 = local_50;
                        pvVar7 = local_58;
                        if (local_58 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035d9;
                          free(pvVar7);
                        }
                        if (pvVar8 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035e6;
                          free(pvVar8);
                        }
                        if (pvVar9 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035f3;
                          free(pvVar9);
                        }
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x1035ff;
                        std::ifstream::close();
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10360b;
                        std::ofstream::close();
                        local_5c = (uint)(local_34 == 0);
                        puVar13 = (undefined1 *)outWorkSize;
                        uVar4 = local_5c;
                        break;
                      }
                      if (0 < (int)uVar11) {
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103251;
                        memset(__s,0,uVar11);
                      }
                      *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x10325f;
                      std::istream::read(auStack_558 + 8,(long)__s);
                      pvVar7 = local_48;
                      uVar12 = local_68;
                      puVar13 = local_70;
                      if ((abStack_530[*(long *)(auStack_558._8_8_ + -0x18)] & 5) != 0) {
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103727;
                        fprintf(_stderr,"Error: %s:%d: Unable to read enough bytes from file: %ld\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                ,0xec,_ifs);
                        pvVar7 = local_48;
                        if (local_48 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103737;
                          free(pvVar7);
                        }
                        pvVar7 = local_58;
                        if (local_58 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103747;
                          free(pvVar7);
                        }
                        pvVar7 = local_40;
                        if (local_40 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103757;
                          free(pvVar7);
                        }
                        pvVar7 = local_50;
                        if (local_50 != (void *)0x0) {
                          *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103767;
                          free(pvVar7);
                        }
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103773;
                        std::ifstream::close();
                        local_5c = 0;
                        *(undefined8 *)((long)&psVar10[-1].field_2 + 8) = 0x103786;
                        std::ofstream::close();
                        puVar13 = (undefined1 *)outWorkSize;
                        uVar4 = local_5c;
                        break;
                      }
                      lVar18 = (long)psVar10 - (interProgSize * local_68 + 0xf & 0xfffffffffffffff0)
                      ;
                      local_78 = (undefined1 *)psVar10;
                      *(undefined8 *)(lVar18 + -8) = 0x1032af;
                      uVar4 = RqInterExecute(pvVar7,uVar12,puVar13,uVar11,lVar18);
                      if (uVar4 != 0) {
                        *(undefined8 *)(lVar18 + -8) = 0x103421;
                        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                ,0xfb,
                                "RqInterExecute(interProgram, symSize, src, sizeof(src), iblock, sizeof(iblock))"
                                ,(ulong)uVar4);
                        pvVar7 = local_48;
                        if (local_48 != (void *)0x0) {
                          *(undefined8 *)(lVar18 + -8) = 0x10342f;
                          free(pvVar7);
                        }
                        pvVar7 = local_58;
                        if (local_58 != (void *)0x0) {
                          *(undefined8 *)(lVar18 + -8) = 0x10343d;
                          free(pvVar7);
                        }
                        pvVar7 = local_40;
                        if (local_40 != (void *)0x0) {
                          *(undefined8 *)(lVar18 + -8) = 0x10344b;
                          free(pvVar7);
                        }
                        pvVar7 = local_50;
                        if (local_50 != (void *)0x0) {
                          *(undefined8 *)(lVar18 + -8) = 0x103459;
                          free(pvVar7);
                        }
                        *(undefined8 *)(lVar18 + -8) = 0x103461;
                        std::ifstream::close();
                        *(undefined8 *)(lVar18 + -8) = 0x10346d;
                        std::ofstream::close();
                        local_34 = uVar4;
                      }
                      psVar10 = local_80;
                      __n = outProgSize;
                      local_5c = 0;
                      uVar11 = local_88;
                      if (uVar4 == 0) {
                        local_60 = uVar5;
                        *(undefined8 *)(lVar18 + -8) = 0x1032f0;
                        memset(psVar10,0,__n);
                        pvVar7 = local_50;
                        uVar11 = local_68;
                        *(undefined8 *)(lVar18 + -8) = 0x10330c;
                        uVar4 = RqOutExecute(pvVar7,uVar11,lVar18,psVar10,__n);
                        uVar11 = local_88;
                        if (uVar4 != 0) {
                          *(undefined8 *)(lVar18 + -8) = 0x1034a4;
                          fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                  ,0x103,
                                  "RqOutExecute(outProgram, symSize, iblock, enc, sizeof(enc))",
                                  (ulong)uVar4);
                          pvVar7 = local_48;
                          if (local_48 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1034b4;
                            free(pvVar7);
                          }
                          pvVar7 = local_58;
                          if (local_58 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1034c4;
                            free(pvVar7);
                          }
                          pvVar7 = local_40;
                          if (local_40 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1034d4;
                            free(pvVar7);
                          }
                          pvVar7 = local_50;
                          if (local_50 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1034e4;
                            free(pvVar7);
                          }
                          *(undefined8 *)(lVar18 + -8) = 0x1034ec;
                          std::ifstream::close();
                          *(undefined8 *)(lVar18 + -8) = 0x1034f8;
                          std::ofstream::close();
                          local_34 = uVar4;
                        }
                        uVar5 = local_60;
                        psVar10 = local_80;
                        if (uVar4 != 0) goto LAB_00103326;
                        *(undefined8 *)(lVar18 + -8) = 0x103352;
                        std::ostream::write((char *)&local_348,(long)psVar10);
                        __s = local_70;
                        bVar19 = true;
                        if (*(int *)(abStack_328 + *(long *)(local_348 + -0x18)) != 0) {
                          *(undefined8 *)(lVar18 + -8) = 0x103391;
                          fprintf(_stderr,"Error:%s:%d: Error while writing to output file\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                                  ,0x10b);
                          pvVar7 = local_48;
                          if (local_48 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1033a1;
                            free(pvVar7);
                          }
                          pvVar7 = local_58;
                          if (local_58 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1033b1;
                            free(pvVar7);
                          }
                          pvVar7 = local_40;
                          if (local_40 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1033c1;
                            free(pvVar7);
                          }
                          pvVar7 = local_50;
                          if (local_50 != (void *)0x0) {
                            *(undefined8 *)(lVar18 + -8) = 0x1033d1;
                            free(pvVar7);
                          }
                          *(undefined8 *)(lVar18 + -8) = 0x1033d9;
                          std::ifstream::close();
                          *(undefined8 *)(lVar18 + -8) = 0x1033e5;
                          std::ofstream::close();
                          local_34 = 1;
                          bVar19 = false;
                        }
                      }
                      else {
LAB_00103326:
                        bVar19 = false;
                        __s = local_70;
                      }
                      psVar10 = (string *)local_78;
                      puVar13 = (undefined1 *)outWorkSize;
                      uVar4 = local_5c;
                    } while (bVar19);
                  }
                }
              }
            }
          }
          else {
            puVar15[-2] = 0x1031b9;
            puVar15[-1] = 0;
            transcode();
            puVar15[-2] = 0x1031c5;
            puVar15[-1] = 0;
            std::ifstream::close();
            puVar15[-2] = 0x1031d1;
            puVar15[-1] = 0;
            std::ofstream::close();
            puVar13 = (undefined1 *)outWorkSize;
            uVar4 = local_5c;
            local_34 = uVar5;
          }
        }
        else {
          puVar15[-2] = 0x10318b;
          puVar15[-1] = 0;
          transcode();
          puVar15[-2] = 0x103197;
          puVar15[-1] = 0;
          std::ifstream::close();
          puVar15[-2] = 0x1031a3;
          puVar15[-1] = 0;
          std::ofstream::close();
          puVar13 = (undefined1 *)outWorkSize;
          uVar4 = local_5c;
          local_34 = uVar5;
        }
      }
      else {
        puVar15[-2] = 0x10315f;
        puVar15[-1] = 0;
        fprintf(_stderr,"Error:%s:%d:  %s failed: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/file_enc_dec.cpp"
                ,0xc5,"RqInterGetMemSizes(K, nExtra, &interWorkSize, &interProgSize, &iblockSymCnt)"
                ,(ulong)uVar5);
        puVar15[-2] = 0x10316b;
        puVar15[-1] = 0;
        std::ifstream::close();
        puVar15[-2] = 0x103177;
        puVar15[-1] = 0;
        std::ofstream::close();
        puVar13 = (undefined1 *)outWorkSize;
        uVar4 = local_5c;
        local_34 = uVar5;
      }
      goto LAB_00103621;
    }
    auStack_560[0] = 0x103112;
    auStack_560[1] = 0;
    transcode();
  }
  else {
    auStack_560[0] = 0x10310b;
    auStack_560[1] = 0;
    transcode();
  }
  auStack_560[0] = 0x10311e;
  auStack_560[1] = 0;
  std::ifstream::close();
  auStack_560[0] = 0x10312c;
  auStack_560[1] = 0;
  std::ofstream::close();
  puVar13 = auStack_558;
  uVar4 = 0;
LAB_00103621:
  local_348 = _VTT;
  *(undefined8 *)((long)&local_348 + *(long *)(_VTT + -0x18)) = _VTT;
  *(undefined8 *)(puVar13 + -8) = 0x10364b;
  std::filebuf::~filebuf((filebuf *)&ofs);
  *(undefined8 *)(puVar13 + -8) = 0x103657;
  std::ios_base::~ios_base(local_250);
  *(undefined8 *)(puVar13 + -8) = 0x103663;
  std::ifstream::~ifstream(auStack_558 + 8);
  return uVar4;
}

Assistant:

int transcode(int K, int symSize, string inputFname, string outputFname, string inputEsiStr,
              string outputEsiStr)
{
    int status = 0;

    RqInterWorkMem* interWork = NULL;
    RqInterProgram* interProgram = NULL;
    RqOutWorkMem*   outWork = NULL;
    RqOutProgram*   outProgram = NULL;

    /* Open input and output files */
    ifstream ifs(inputFname, ios::binary|ios::ate);
    int length = ifs.tellg();
    ifs.seekg(0, ios::beg);

    ofstream ofs(outputFname, ios::binary);

#define DONE()                                                  \
    do {                                                        \
        if (interProgram)    free(interProgram);                \
        if (interWork)       free(interWork);                   \
        if (outWork)         free(outWork);                     \
        if (outProgram)      free(outProgram);                  \
        ifs.close();                                            \
        ofs.close();                                            \
        if (status == 0) return true; else return false;        \
    } while(0);
#define RUN_NOFAIL(x)   RUN_NOFAIL__INT(x, RUN_NOFAIL__err)
#define RUN_NOFAIL__INT(x,           err)                       \
    do {                                                        \
        int err;                                                \
        if ((err = (x)) != 0) {                                 \
            fprintf(stderr, "Error:%s:%d:  %s failed: %d\n",    \
                    __FILE__, __LINE__, #x, err);               \
            status = err;                                       \
            DONE();                                             \
        }                                                       \
    } while(0)

    if (!ifs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open input file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    if (!ofs ) {
        fprintf(stderr,  "Error:%s:%d: Unable to open output file\n",
                __FILE__, __LINE__);

        status = 1;
        DONE();
    }

    /* Setup src block */
    int inputEsiCnt = getESICnt(inputEsiStr);
    uint8_t src[inputEsiCnt * symSize];

    uint32_t ESIs_input[inputEsiCnt];
    parseESIStr(inputEsiStr, inputEsiCnt, ESIs_input);

    size_t interWorkSize, interProgSize, iblockSymCnt;

    /* Get various memory sizes from RQ API */
    const int nExtra = inputEsiCnt - K;
    RUN_NOFAIL(RqInterGetMemSizes(K,
                                nExtra,
                                &interWorkSize,
                                &interProgSize,
                                &iblockSymCnt));

    /* Create encoding interProgram */
    interWork = (RqInterWorkMem* )malloc(interWorkSize);
    RUN_NOFAIL(RqInterInit(K, nExtra, interWork, interWorkSize));
    for (int i = 0; i < inputEsiCnt; ++i) {
        RqInterAddIds(interWork, ESIs_input[i], 1);
    }

    interProgram = (RqInterProgram*)malloc(interProgSize);
    RUN_NOFAIL(RqInterCompile(interWork, interProgram, interProgSize));

    /* Setup enc block */
    int outputEsiCnt = getESICnt(outputEsiStr);
    uint32_t ESIs_wanted[outputEsiCnt];

    parseESIStr(outputEsiStr, outputEsiCnt, ESIs_wanted);
    uint8_t enc[outputEsiCnt * symSize];

    /* Create encoding output symbol Program */
    size_t outWorkSize, outProgSize;
    RUN_NOFAIL(RqOutGetMemSizes(outputEsiCnt, &outWorkSize, &outProgSize));
    outWork = (RqOutWorkMem*) malloc(outWorkSize);
    outProgram = (RqOutProgram*) malloc(outProgSize);
    RUN_NOFAIL(RqOutInit(K, outWork, outWorkSize));
    for (int i = 0; i < outputEsiCnt; ++i)
        RUN_NOFAIL(RqOutAddIds(outWork, ESIs_wanted[i], 1));
    RUN_NOFAIL(RqOutCompile(outWork, outProgram, outProgSize));

    /* Iterate through the input file and transcode the data */
    int count =  0;
    while (count < length) {
        for (int i = 0; i < inputEsiCnt * symSize; ++i) {
            src[i] = 0x00;
        }

        ifs.read((char*)src, inputEsiCnt * symSize);
        if (!ifs) {
            fprintf(stderr, "Error: %s:%d: Unable to read enough bytes from file: %ld\n",
                    __FILE__, __LINE__, ifs.gcount());

            status = 1;
            DONE();
        }

        count += inputEsiCnt * symSize;

        /* Create intermediate block */
        uint8_t iblock[iblockSymCnt * symSize];
        RUN_NOFAIL(RqInterExecute(interProgram,         // interProgram
				  symSize,            // symbol size
				  src,                // symbol data
				  sizeof(src),        // sizeof symbol data
				  iblock,             // i-block
				  sizeof(iblock))); // size thereof

        /* Compute encoding/decoding */
        memset(enc, 0, sizeof(enc));
        RUN_NOFAIL(RqOutExecute(outProgram,
                                    symSize,
                                    iblock,
                                    enc,
                                    sizeof(enc)));

        /* End of transcode */

        /* Write out data to output file */
        ofs.write ((char*)(&enc[0]), sizeof(enc));
        if (!ofs.good() ) {
            fprintf(stderr,  "Error:%s:%d: Error while writing to output file\n",
                    __FILE__, __LINE__);

            status = 1;
            DONE();
        }
    }

    DONE();
#undef RUN_NOFAIL__INT
#undef RUN_NOFAIL
#undef DONE
}